

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O3

Machine * unifyVariable(Machine *__return_storage_ptr__,Machine *m,Register r)

{
  size_type *psVar1;
  uint uVar2;
  long lVar3;
  Hix HVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  Hcell h;
  key_type local_34 [2];
  Register r_local;
  
  local_34[0].r = r.r;
  if (m->mode == Write) {
    h.f_._32_8_ = &m->h;
    uVar2 = (m->h).hix;
    psVar1 = &h.f_.id._M_string_length;
    h.f_.id._M_string_length._0_4_ = 0x62726167;
    h.f_.id._M_dataplus._M_p = (pointer)0x7;
    h.f_.id._M_string_length._4_4_ = 0x656761;
    h.f_.id.field_2._8_4_ = 0xffffffd6;
    h._0_8_ = psVar1;
    pmVar5 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,(key_type *)h.f_._32_8_);
    lVar3 = (ulong)uVar2 << 0x20;
    pmVar5->tag = (int)lVar3;
    pmVar5->hix_ = (Hix)(int)((ulong)lVar3 >> 0x20);
    std::__cxx11::string::operator=((string *)&pmVar5->f_,(string *)&h);
    (pmVar5->f_).arity = h.f_.id.field_2._8_4_;
    if ((size_type *)h._0_8_ != psVar1) {
      operator_delete((void *)h._0_8_,
                      CONCAT44(h.f_.id._M_string_length._4_4_,(undefined4)h.f_.id._M_string_length)
                      + 1);
    }
    pmVar5 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,(key_type *)h.f_._32_8_);
    pmVar6 = std::
             map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
             ::operator[](&m->regval,local_34);
    HVar4.hix = (pmVar5->hix_).hix;
    pmVar6->tag = pmVar5->tag;
    pmVar6->hix_ = (Hix)HVar4.hix;
    std::__cxx11::string::_M_assign((string *)&pmVar6->f_);
    (pmVar6->f_).arity = (pmVar5->f_).arity;
    (m->h).hix = (m->h).hix + 1;
  }
  else if (m->mode == Read) {
    pmVar5 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&m->s);
    pmVar6 = std::
             map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
             ::operator[](&m->regval,local_34);
    HVar4.hix = (pmVar5->hix_).hix;
    pmVar6->tag = pmVar5->tag;
    pmVar6->hix_ = (Hix)HVar4.hix;
    std::__cxx11::string::_M_assign((string *)&pmVar6->f_);
    (pmVar6->f_).arity = (pmVar5->f_).arity;
  }
  (m->s).hix = (m->s).hix + 1;
  std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->heap)._M_t._M_impl.super__Rb_tree_header,
             &(m->heap)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->regval)._M_t._M_impl.super__Rb_tree_header,
             &(m->regval)._M_t._M_impl.super__Rb_tree_header);
  __return_storage_ptr__->mode = m->mode;
  HVar4.hix = (m->s).hix;
  __return_storage_ptr__->h = (Hix)(m->h).hix;
  __return_storage_ptr__->s = (Hix)HVar4.hix;
  return __return_storage_ptr__;
}

Assistant:

Machine unifyVariable(Machine m, Register r) {
    switch (m.mode) {
        case Mode::Read:
            m.regval[r] = m.heap[m.s];
            break;
        case Mode::Write:
            m.heap[m.h] = Hcell::ref(m.h);
            m.regval[r] = m.heap[m.h];
            m.h += 1;
            break;
    }
    m.s += 1;
    return m;
}